

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

FunctionValue *
SelectBestFunction(FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
                  ArrayView<FunctionValue> functions,IntrusiveList<TypeHandle> generics,
                  ArrayView<ArgumentData> arguments,SmallArray<unsigned_int,_32U> *ratings)

{
  TypeFunction *pTVar1;
  ModuleData *pMVar2;
  ModuleData *pMVar3;
  TypeBase *pTVar4;
  FunctionValue proto;
  ArrayView<ArgumentData> arguments_00;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  TypeRef *pTVar8;
  MatchData *pMVar9;
  TypeFunction *pTVar10;
  TypeFunction **ppTVar11;
  TypeHandle *pTVar12;
  TypeClass *pTVar13;
  ModuleData **ppMVar14;
  ArrayView<CallArgumentData> arguments_01;
  ArrayView<CallArgumentData> arguments_02;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<ArgumentData> arguments_03;
  ArrayView<CallArgumentData> arguments_04;
  FunctionValue local_3a0;
  ArgumentData *local_388;
  undefined8 uStack_380;
  TypeHandle *local_378;
  TypeHandle *pTStack_370;
  ModuleData *local_368;
  ModuleData *pMStack_360;
  ModuleData *local_358;
  FunctionData *local_350;
  FunctionData *function_2;
  FunctionData *pFStack_340;
  uint i_3;
  FunctionData *function_1;
  FunctionValue value_1;
  undefined1 auStack_318 [4];
  uint i_2;
  FunctionValue bestGenericFunction;
  uint bestGenericRating;
  uint bestRating;
  uint bDepth;
  uint aDepth;
  uint arg;
  bool sameArguments;
  FunctionData *b;
  uint k;
  FunctionData *a;
  undefined1 auStack_2c8 [4];
  uint i_1;
  undefined4 local_2c0;
  undefined1 local_2b8 [12];
  TypeFunction *local_2a8;
  TypeFunction *instance;
  TypeHandle *currGeneric;
  MatchData *currMatch;
  IntrusiveList<MatchData> aliases;
  TypeBase *parentType;
  undefined4 local_270;
  ArgumentData *local_268;
  uint uStack_260;
  undefined4 uStack_25c;
  undefined1 local_258 [12];
  uint local_248;
  char local_241;
  uint extraRating;
  bool sameGenerics;
  TypeHandle *cb;
  MatchData *ca;
  TypeClass *typeClass;
  TypeRef *typeRef;
  FunctionData *function;
  FunctionValue value;
  TypeClass *pTStack_1f8;
  uint i;
  TypeClass *preferredParent;
  undefined1 local_1e0 [8];
  SmallArray<CallArgumentData,_16U> result;
  SmallArray<TypeFunction_*,_16U> instanceTypes;
  SmallArray<unsigned_int,_32U> *ratings_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  ArrayView<FunctionValue> functions_local;
  
  arguments_00 = arguments;
  ctx_local = (ExpressionContext *)functions.data;
  functions_local.data._0_4_ = functions.count;
  SmallArray<unsigned_int,_32U>::resize(ratings,(uint)functions_local.data);
  SmallArray<TypeFunction_*,_16U>::SmallArray
            ((SmallArray<TypeFunction_*,_16U> *)&result.allocator,ctx->allocator);
  SmallArray<CallArgumentData,_16U>::SmallArray
            ((SmallArray<CallArgumentData,_16U> *)local_1e0,ctx->allocator);
  pTStack_1f8 = (TypeClass *)0x0;
  value.context._4_4_ = 0;
  do {
    arguments.data = arguments_00.data;
    arguments._8_8_ = arguments_00._8_8_;
    if ((uint)functions_local.data <= value.context._4_4_) {
      if (pTStack_1f8 != (TypeClass *)0x0) {
        for (a._4_4_ = 0; a._4_4_ < (uint)functions_local.data; a._4_4_ = a._4_4_ + 1) {
          pMVar2 = (ctx_local->uniqueDependencies).little[(ulong)a._4_4_ * 3 + -5];
          for (b._4_4_ = 0;
              uVar6 = ArrayView<FunctionValue>::size((ArrayView<FunctionValue> *)&ctx_local),
              b._4_4_ < uVar6; b._4_4_ = b._4_4_ + 1) {
            if (((a._4_4_ != b._4_4_) && (ratings->data[b._4_4_] != 0xffffffff)) &&
               (pMVar3 = (ctx_local->uniqueDependencies).little[(ulong)b._4_4_ * 3 + -5],
               ratings->data[a._4_4_] == ratings->data[b._4_4_])) {
              ppTVar11 = SmallArray<TypeFunction_*,_16U>::operator[]
                                   ((SmallArray<TypeFunction_*,_16U> *)&result.allocator,a._4_4_);
              uVar6 = IntrusiveList<TypeHandle>::size(&(*ppTVar11)->arguments);
              ppTVar11 = SmallArray<TypeFunction_*,_16U>::operator[]
                                   ((SmallArray<TypeFunction_*,_16U> *)&result.allocator,b._4_4_);
              uVar7 = IntrusiveList<TypeHandle>::size(&(*ppTVar11)->arguments);
              if (uVar6 == uVar7) {
                bVar5 = true;
                bDepth = 0;
                while( true ) {
                  ppTVar11 = SmallArray<TypeFunction_*,_16U>::operator[]
                                       ((SmallArray<TypeFunction_*,_16U> *)&result.allocator,a._4_4_
                                       );
                  uVar6 = IntrusiveList<TypeHandle>::size(&(*ppTVar11)->arguments);
                  if (uVar6 <= bDepth) break;
                  ppTVar11 = SmallArray<TypeFunction_*,_16U>::operator[]
                                       ((SmallArray<TypeFunction_*,_16U> *)&result.allocator,a._4_4_
                                       );
                  pTVar12 = IntrusiveList<TypeHandle>::operator[](&(*ppTVar11)->arguments,bDepth);
                  pTVar4 = pTVar12->type;
                  ppTVar11 = SmallArray<TypeFunction_*,_16U>::operator[]
                                       ((SmallArray<TypeFunction_*,_16U> *)&result.allocator,b._4_4_
                                       );
                  pTVar12 = IntrusiveList<TypeHandle>::operator[](&(*ppTVar11)->arguments,bDepth);
                  if (pTVar4 != pTVar12->type) {
                    bVar5 = false;
                  }
                  bDepth = bDepth + 1;
                }
                if (bVar5) {
                  pTVar13 = getType<TypeClass>(*(TypeBase **)(*(long *)&pMVar2->importIndex + 0x20))
                  ;
                  uVar6 = anon_unknown.dwarf_e7629::GetDerivedFromDepth(pTStack_1f8,pTVar13);
                  pTVar13 = getType<TypeClass>(*(TypeBase **)(*(long *)&pMVar3->importIndex + 0x20))
                  ;
                  uVar7 = anon_unknown.dwarf_e7629::GetDerivedFromDepth(pTStack_1f8,pTVar13);
                  if (uVar6 < uVar7) {
                    ratings->data[b._4_4_] = 0xffffffff;
                  }
                }
              }
            }
          }
        }
      }
      bestGenericFunction.context._4_4_ = 0xffffffff;
      FunctionValue::FunctionValue(__return_storage_ptr__);
      bestGenericFunction.context._0_4_ = 0xffffffff;
      FunctionValue::FunctionValue((FunctionValue *)auStack_318);
      for (value_1.context._4_4_ = 0; value_1.context._4_4_ < (uint)functions_local.data;
          value_1.context._4_4_ = value_1.context._4_4_ + 1) {
        ppMVar14 = (ctx_local->uniqueDependencies).little + (ulong)value_1.context._4_4_ * 3 + -6;
        function_1 = (FunctionData *)*ppMVar14;
        pFStack_340 = (FunctionData *)ppMVar14[1];
        value_1.function = (FunctionData *)ppMVar14[2];
        value_1.source = (SynBase *)pFStack_340;
        bVar5 = ExpressionContext::IsGenericFunction(ctx,pFStack_340);
        if (bVar5) {
          if (ratings->data[value_1.context._4_4_] < (uint)bestGenericFunction.context) {
            bestGenericFunction.context._0_4_ = ratings->data[value_1.context._4_4_];
            _auStack_318 = function_1;
            bestGenericFunction.source = value_1.source;
            bestGenericFunction.function = value_1.function;
          }
        }
        else if (ratings->data[value_1.context._4_4_] < bestGenericFunction.context._4_4_) {
          bestGenericFunction.context._4_4_ = ratings->data[value_1.context._4_4_];
          __return_storage_ptr__->source = (SynBase *)function_1;
          __return_storage_ptr__->function = (FunctionData *)value_1.source;
          __return_storage_ptr__->context = (ExprBase *)value_1.function;
        }
      }
      if ((uint)bestGenericFunction.context < bestGenericFunction.context._4_4_) {
        bestGenericFunction.context._4_4_ = (uint)bestGenericFunction.context;
        __return_storage_ptr__->source = (SynBase *)_auStack_318;
        __return_storage_ptr__->function = (FunctionData *)bestGenericFunction.source;
        __return_storage_ptr__->context = (ExprBase *)bestGenericFunction.function;
      }
      else {
        for (function_2._4_4_ = 0; function_2._4_4_ < (uint)functions_local.data;
            function_2._4_4_ = function_2._4_4_ + 1) {
          local_350 = (FunctionData *)
                      (ctx_local->uniqueDependencies).little[(ulong)function_2._4_4_ * 3 + -5];
          bVar5 = ExpressionContext::IsGenericFunction(ctx,local_350);
          if (bVar5) {
            if (((bestGenericFunction.context._4_4_ != 0xffffffff) &&
                (ratings->data[function_2._4_4_] == bestGenericFunction.context._4_4_)) &&
               ((*(TypeStruct **)
                  &(ctx_local->uniqueDependencies).little[(ulong)function_2._4_4_ * 3 + -4]->
                   importIndex == ctx->typeAutoRef &&
                ((local_350->scope->ownerType->isGeneric & 1U) == 0)))) {
              local_358 = (ctx_local->uniqueDependencies).little[(ulong)function_2._4_4_ * 3 + -4];
              ppMVar14 = (ctx_local->uniqueDependencies).little + (ulong)function_2._4_4_ * 3 + -6;
              local_368 = *ppMVar14;
              pMStack_360 = ppMVar14[1];
              local_378 = generics.head;
              pTStack_370 = generics.tail;
              local_388 = arguments.data;
              uStack_380._0_4_ = arguments.count;
              uStack_380._4_4_ = arguments._12_4_;
              proto.context._0_4_ = (int)local_358;
              proto.source = (SynBase *)ppMVar14[0];
              proto.function = (FunctionData *)ppMVar14[1];
              proto.context._4_4_ = (int)((ulong)local_358 >> 0x20);
              CreateGenericFunctionInstance(&local_3a0,ctx,source,proto,generics,arguments_00,true);
            }
            ratings->data[function_2._4_4_] = 0xffffffff;
          }
        }
      }
      SmallArray<CallArgumentData,_16U>::~SmallArray((SmallArray<CallArgumentData,_16U> *)local_1e0)
      ;
      SmallArray<TypeFunction_*,_16U>::~SmallArray
                ((SmallArray<TypeFunction_*,_16U> *)&result.allocator);
      return __return_storage_ptr__;
    }
    value.function =
         (FunctionData *)(ctx_local->uniqueDependencies).little[(ulong)value.context._4_4_ * 3 + -4]
    ;
    ppMVar14 = (ctx_local->uniqueDependencies).little + (ulong)value.context._4_4_ * 3 + -6;
    function = (FunctionData *)*ppMVar14;
    typeRef = (TypeRef *)ppMVar14[1];
    value.source = (SynBase *)typeRef;
    SmallArray<TypeFunction_*,_16U>::push_back
              ((SmallArray<TypeFunction_*,_16U> *)&result.allocator,
               (TypeFunction **)&(typeRef->super_TypeBase).typeIndex);
    typeClass = (TypeClass *)getType<TypeRef>((TypeBase *)(value.function)->scope);
    pTVar13 = pTStack_1f8;
    if (((typeClass != (TypeClass *)0x0) &&
        (ca = (MatchData *)getType<TypeClass>((TypeBase *)(typeClass->super_TypeStruct).typeScope),
        (TypeClass *)ca != (TypeClass *)0x0)) &&
       (((((TypeClass *)ca)->extendable & 1U) != 0 &&
        ((pTVar13 = (TypeClass *)ca, pTStack_1f8 != (TypeClass *)0x0 &&
         (pTVar13 = pTStack_1f8, pTStack_1f8 != (TypeClass *)ca)))))) {
      __assert_fail("preferredParent == typeClass",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x19f1,
                    "FunctionValue SelectBestFunction(ExpressionContext &, SynBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, SmallArray<unsigned int, 32> &)"
                   );
    }
    pTStack_1f8 = pTVar13;
    bVar5 = IntrusiveList<TypeHandle>::empty(&generics);
    if (bVar5) {
LAB_0024a3ba:
      local_248 = 0;
      ArrayView<ArgumentData>::ArrayView<4u>
                ((ArrayView<ArgumentData> *)local_258,
                 (SmallArray<ArgumentData,_4U> *)&typeRef[1].super_TypeBase.typeID);
      local_268 = arguments.data;
      arguments._0_12_ = arguments_00._0_12_;
      uStack_260 = arguments_00.count;
      uStack_25c = arguments_00._12_4_;
      functionArguments._12_4_ = 0;
      functionArguments.data = (ArgumentData *)local_258._0_8_;
      functionArguments.count = local_258._8_4_;
      arguments_03._12_4_ = 0;
      arguments_03.data = arguments.data;
      arguments_03.count = arguments.count;
      bVar5 = PrepareArgumentsForFunctionCall
                        (ctx,source,functionArguments,arguments_03,
                         (SmallArray<CallArgumentData,_16U> *)local_1e0,&local_248,false);
      pTVar8 = typeRef;
      if (bVar5) {
        pTVar1 = *(TypeFunction **)&(typeRef->super_TypeBase).typeIndex;
        ArrayView<CallArgumentData>::ArrayView<16u>
                  ((ArrayView<CallArgumentData> *)&parentType,
                   (SmallArray<CallArgumentData,_16U> *)local_1e0);
        arguments_01._12_4_ = 0;
        arguments_01.data = (CallArgumentData *)parentType;
        arguments_01.count = local_270;
        uVar6 = GetFunctionRating(ctx,(FunctionData *)pTVar8,pTVar1,arguments_01);
        ratings->data[value.context._4_4_] = uVar6;
        if (ratings->data[value.context._4_4_] != 0xffffffff) {
          ratings->data[value.context._4_4_] = local_248 + ratings->data[value.context._4_4_];
          bVar5 = ExpressionContext::IsGenericFunction(ctx,(FunctionData *)typeRef);
          if (bVar5) {
            aliases.tail = (MatchData *)0x0;
            if ((value.function)->scope == (ScopeData *)ctx->typeAutoRef) {
              if (*(long *)((typeRef->super_TypeBase).name.end + 0x20) == 0) {
                __assert_fail("function->scope->ownerType",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x1a2b,
                              "FunctionValue SelectBestFunction(ExpressionContext &, SynBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, SmallArray<unsigned int, 32> &)"
                             );
              }
              aliases.tail = *(MatchData **)((typeRef->super_TypeBase).name.end + 0x20);
            }
            else if (*(long *)((typeRef->super_TypeBase).name.end + 0x20) != 0) {
              pTVar8 = getType<TypeRef>((TypeBase *)(value.function)->scope);
              aliases.tail = (MatchData *)pTVar8->subType;
            }
            IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&currMatch);
            currGeneric = (typeRef->super_TypeBase).arrayTypes.head;
            instance = (TypeFunction *)generics.head;
            for (; pTVar8 = typeRef, pMVar9 = aliases.tail,
                currGeneric != (TypeHandle *)0x0 && instance != (TypeFunction *)0x0;
                currGeneric = *(TypeHandle **)&currGeneric->listed) {
              pMVar9 = ExpressionContext::get<MatchData>(ctx);
              MatchData::MatchData
                        (pMVar9,(SynIdentifier *)currGeneric->type,
                         (TypeBase *)(instance->super_TypeBase)._vptr_TypeBase);
              IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)&currMatch,pMVar9);
              instance = *(TypeFunction **)&(instance->super_TypeBase).typeID;
            }
            ArrayView<CallArgumentData>::ArrayView<16u>
                      ((ArrayView<CallArgumentData> *)local_2b8,
                       (SmallArray<CallArgumentData,_16U> *)local_1e0);
            arguments_04._12_4_ = 0;
            arguments_04.data = (CallArgumentData *)local_2b8._0_8_;
            arguments_04.count = local_2b8._8_4_;
            pTVar10 = GetGenericFunctionInstanceType
                                (ctx,source,(TypeBase *)pMVar9,(FunctionData *)pTVar8,arguments_04,
                                 (IntrusiveList<MatchData> *)&currMatch);
            local_2a8 = pTVar10;
            ppTVar11 = SmallArray<TypeFunction_*,_16U>::back
                                 ((SmallArray<TypeFunction_*,_16U> *)&result.allocator);
            pTVar8 = typeRef;
            pTVar1 = local_2a8;
            *ppTVar11 = pTVar10;
            if (local_2a8 == (TypeFunction *)0x0) {
              ratings->data[value.context._4_4_] = 0xffffffff;
            }
            else {
              ArrayView<CallArgumentData>::ArrayView<16u>
                        ((ArrayView<CallArgumentData> *)auStack_2c8,
                         (SmallArray<CallArgumentData,_16U> *)local_1e0);
              arguments_02._12_4_ = 0;
              arguments_02.data = (CallArgumentData *)_auStack_2c8;
              arguments_02.count = local_2c0;
              uVar6 = GetFunctionRating(ctx,(FunctionData *)pTVar8,pTVar1,arguments_02);
              ratings->data[value.context._4_4_] = uVar6;
            }
          }
        }
      }
      else {
        ratings->data[value.context._4_4_] = 0xffffffff;
      }
    }
    else {
      cb = (typeRef->super_TypeBase).arrayTypes.head;
      _extraRating = generics.head;
      local_241 = '\x01';
      for (; cb != (TypeHandle *)0x0 && _extraRating != (TypeHandle *)0x0;
          cb = *(TypeHandle **)&cb->listed) {
        if ((((ulong)cb->next[2].next & 0x100000000) == 0) &&
           ((TypeBase *)cb->next != _extraRating->type)) {
          local_241 = '\0';
          break;
        }
        _extraRating = _extraRating->next;
      }
      if (local_241 == '\0') {
        ratings->data[value.context._4_4_] = 0xffffffff;
      }
      else {
        if (_extraRating == (TypeHandle *)0x0) goto LAB_0024a3ba;
        ratings->data[value.context._4_4_] = 0xffffffff;
      }
    }
    value.context._4_4_ = value.context._4_4_ + 1;
  } while( true );
}

Assistant:

FunctionValue SelectBestFunction(ExpressionContext &ctx, SynBase *source, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, SmallArray<unsigned, 32> &ratings)
{
	ratings.resize(functions.count);

	SmallArray<TypeFunction*, 16> instanceTypes(ctx.allocator);

	SmallArray<CallArgumentData, 16> result(ctx.allocator);

	TypeClass *preferredParent = NULL;

	for(unsigned i = 0; i < functions.count; i++)
	{
		FunctionValue value = functions.data[i];

		FunctionData *function = value.function;

		instanceTypes.push_back(function->type);

		if(TypeRef *typeRef = getType<TypeRef>(value.context->type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(typeRef->subType))
			{
				if(typeClass->extendable)
				{
					if(!preferredParent)
						preferredParent = typeClass;
					else
						assert(preferredParent == typeClass);
				}
			}
		}

		if(!generics.empty())
		{
			MatchData *ca = function->generics.head;
			TypeHandle *cb = generics.head;

			bool sameGenerics = true;

			for(; ca && cb; ca = ca->next, cb = cb->next)
			{
				if(!ca->type->isGeneric && ca->type != cb->type)
				{
					sameGenerics = false;
					break;
				}
			}

			// Fail if provided explicit type list elements can't match
			if(!sameGenerics)
			{
				ratings.data[i] = ~0u;
				continue;
			}

			// Fail if provided explicit type list is larger than expected explicit type list
			if(cb)
			{
				ratings.data[i] = ~0u;
				continue;
			}
		}

		unsigned extraRating = 0;

		// Handle named argument order, default argument values and variadic functions
		if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, &extraRating, false))
		{
			ratings.data[i] = ~0u;
			continue;
		}

		ratings.data[i] = GetFunctionRating(ctx, function, function->type, result);

		if(ratings.data[i] == ~0u)
			continue;

		ratings.data[i] += extraRating;

		if(ctx.IsGenericFunction(function))
		{
			TypeBase *parentType = NULL;

			if(value.context->type == ctx.typeAutoRef)
			{
				assert(function->scope->ownerType);
				parentType = function->scope->ownerType;
			}
			else if(function->scope->ownerType)
			{
				parentType = getType<TypeRef>(value.context->type)->subType;
			}

			IntrusiveList<MatchData> aliases;

			{
				MatchData *currMatch = function->generics.head;
				TypeHandle *currGeneric = generics.head;

				for(; currMatch && currGeneric; currMatch = currMatch->next, currGeneric = currGeneric->next)
					aliases.push_back(new (ctx.get<MatchData>()) MatchData(currMatch->name, currGeneric->type));
			}

			TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases);

			instanceTypes.back() = instance;

			if(!instance)
			{
				ratings.data[i] = ~0u;
				continue;
			}
			
			ratings.data[i] = GetFunctionRating(ctx, function, instance, result);

			if(ratings.data[i] == ~0u)
				continue;
		}
	}

	// For member functions, if there are multiple functions with the same rating and arguments, hide those which parent is derived further from preferred parent
	if(preferredParent)
	{
		for(unsigned i = 0; i < functions.count; i++)
		{
			FunctionData *a = functions.data[i].function;

			for(unsigned k = 0; k < functions.size(); k++)
			{
				if(i == k)
					continue;

				if(ratings.data[k] == ~0u)
					continue;

				FunctionData *b = functions.data[k].function;

				if(ratings.data[i] == ratings.data[k] && instanceTypes[i]->arguments.size() == instanceTypes[k]->arguments.size())
				{
					bool sameArguments = true;

					for(unsigned arg = 0; arg < instanceTypes[i]->arguments.size(); arg++)
					{
						if(instanceTypes[i]->arguments[arg]->type != instanceTypes[k]->arguments[arg]->type)
							sameArguments = false;
					}

					if(sameArguments)
					{
						unsigned aDepth = GetDerivedFromDepth(preferredParent, getType<TypeClass>(a->scope->ownerType));
						unsigned bDepth = GetDerivedFromDepth(preferredParent, getType<TypeClass>(b->scope->ownerType));

						if (aDepth < bDepth)
							ratings.data[k] = ~0u;
					}
				}
			}
		}
	}

	// Select best generic and non-generic function
	unsigned bestRating = ~0u;
	FunctionValue bestFunction;

	unsigned bestGenericRating = ~0u;
	FunctionValue bestGenericFunction;

	for(unsigned i = 0; i < functions.count; i++)
	{
		FunctionValue value = functions.data[i];

		FunctionData *function = value.function;

		if(ctx.IsGenericFunction(function))
		{
			if(ratings.data[i] < bestGenericRating)
			{
				bestGenericRating = ratings.data[i];
				bestGenericFunction = value;
			}
		}
		else
		{
			if(ratings.data[i] < bestRating)
			{
				bestRating = ratings.data[i];
				bestFunction = value;
			}
		}
	}

	// Use generic function only if it is better that selected
	if(bestGenericRating < bestRating)
	{
		bestRating = bestGenericRating;
		bestFunction = bestGenericFunction;
	}
	else
	{
		// Hide all generic functions from selection
		for(unsigned i = 0; i < functions.count; i++)
		{
			FunctionData *function = functions.data[i].function;

			if(ctx.IsGenericFunction(function))
			{
				if(bestRating != ~0u && ratings.data[i] == bestRating && functions.data[i].context->type == ctx.typeAutoRef && !function->scope->ownerType->isGeneric)
					CreateGenericFunctionInstance(ctx, source, functions.data[i], generics, arguments, true);

				ratings.data[i] = ~0u;
			}
		}
	}

	return bestFunction;
}